

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

bool __thiscall trun::Process_Unix::PrepareFileDescriptors(Process_Unix *this)

{
  int __errnum;
  ILogger *this_00;
  char *arguments_2;
  string local_38;
  
  __errnum = posix_spawn_file_actions_init((posix_spawn_file_actions_t *)&this->child_fd_actions);
  if (__errnum != 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Process_Unix","");
    this_00 = gnilk::Logger::GetLogger(&local_38);
    arguments_2 = strerror(__errnum);
    gnilk::Log::Error<char_const*,int,char*>
              (this_00,"posix_spawn_file_actions_init %d, %s",__errnum,arguments_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __errnum == 0;
}

Assistant:

bool Process_Unix::PrepareFileDescriptors() {
	int status = posix_spawn_file_actions_init(&child_fd_actions);
	if (status != 0) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("posix_spawn_file_actions_init %d, %s", status, strerror(status));
		return false;
	}
	return true;
}